

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne(Abc_Ntk_t *pNtk,int fForward,int fVerbose)

{
  uint *puVar1;
  int *piVar2;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void **ppvVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pObj;
  Vec_Ptr_t *pVVar6;
  long *plVar7;
  void *pvVar8;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *p_03;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  char *pcVar14;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  Abc_Ntk_t *local_78;
  
  iVar18 = 0;
  pObj = pNtk;
  if (fForward == 0) {
    for (; iVar18 < pNtk->vPis->nSize; iVar18 = iVar18 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar18);
      pAVar5->field_0x14 = pAVar5->field_0x14 | 0x10;
    }
    for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
      pAVar5 = Abc_NtkBox(pNtk,iVar18);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 | 0x10;
        puVar1 = (uint *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x14);
        *puVar1 = *puVar1 | 0x10;
      }
    }
    for (iVar18 = 0; iVar18 < pNtk->vPos->nSize; iVar18 = iVar18 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar18);
      Abc_NtkMarkCone_rec(pAVar5,0);
    }
  }
  else {
    for (; iVar18 < pNtk->vPos->nSize; iVar18 = iVar18 + 1) {
      pObj = pNtk;
      pAVar5 = Abc_NtkPo(pNtk,iVar18);
      pAVar5->field_0x14 = pAVar5->field_0x14 | 0x10;
    }
    for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
      pObj = pNtk;
      pAVar5 = Abc_NtkBox(pNtk,iVar18);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 | 0x10;
        puVar1 = (uint *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x14);
        *puVar1 = *puVar1 | 0x10;
      }
    }
    for (iVar18 = 0; iVar18 < pNtk->vPis->nSize; iVar18 = iVar18 + 1) {
      pObj = (Abc_Ntk_t *)Abc_NtkPi(pNtk,iVar18);
      Abc_NtkMarkCone_rec((Abc_Obj_t *)pObj,1);
    }
    pVVar6 = Vec_PtrAlloc((int)pObj);
    for (iVar18 = 0; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
      plVar7 = (long *)Vec_PtrEntry(pNtk->vObjs,iVar18);
      if ((plVar7 != (long *)0x0) && ((*(byte *)((long)plVar7 + 0x14) & 0x10) != 0)) {
        for (lVar20 = 0; lVar20 < *(int *)((long)plVar7 + 0x1c); lVar20 = lVar20 + 1) {
          pvVar8 = *(void **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                             (long)*(int *)(plVar7[4] + lVar20 * 4) * 8);
          if ((*(byte *)((long)pvVar8 + 0x14) & 0x10) == 0) {
            Vec_PtrPush(pVVar6,pvVar8);
          }
        }
      }
    }
    iVar18 = pVVar6->nSize;
    iVar19 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
      iVar19 = 0;
    }
    for (; iVar18 != iVar19; iVar19 = iVar19 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar6,iVar19);
      *(byte *)((long)pvVar8 + 0x14) = *(byte *)((long)pvVar8 + 0x14) | 0x10;
    }
    Vec_PtrFree(pVVar6);
  }
  pVVar6 = Abc_NtkMaxFlow(pNtk,fForward,fVerbose);
  if (pVVar6->nSize < pNtk->nObjCounts[8]) {
    if (fForward == 0) {
      local_78 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
      Abc_NtkIncrementTravId(pNtk);
      for (iVar18 = 0; iVar18 < pVVar6->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar6,iVar18);
        pAVar12 = Abc_NtkCreateObj(local_78,ABC_OBJ_PI);
        (pAVar5->field_6).pCopy = pAVar12;
        Abc_NodeSetTravIdCurrent(pAVar5);
      }
      for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar18);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          pAVar5 = Abc_NtkRetimeMinAreaConstructNtk_rec
                             (local_78,(Abc_Obj_t *)
                                       pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
          pAVar12 = Abc_NtkCreateObj(local_78,ABC_OBJ_PO);
          Abc_ObjAddFanin(pAVar12,pAVar5);
        }
      }
      for (iVar18 = 0; iVar18 < pVVar6->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar6,iVar18);
        Abc_NodeSetTravIdPrevious(pAVar5);
      }
      for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar18);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          Abc_NodeSetTravIdPrevious(pAVar5);
        }
      }
      Abc_NtkAddDummyPiNames(local_78);
      Abc_NtkAddDummyPoNames(local_78);
      iVar18 = Abc_NtkCheck(local_78);
      if (iVar18 == 0) {
        fwrite("Abc_NtkRetimeMinAreaConstructNtk(): Network check has failed.\n",0x3e,1,_stdout);
      }
    }
    else {
      Abc_NtkIncrementTravId(pNtk);
      for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar18);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          aVar15._1_7_ = 0;
          aVar15.iTemp._0_1_ = (pAVar5->field_5).pData == (void *)0x2;
          pAVar5->field_6 = aVar15;
          Abc_NodeSetTravIdCurrent(pAVar5);
        }
      }
      for (iVar18 = 0; iVar18 < pVVar6->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar6,iVar18);
        Abc_NtkRetimeMinAreaInitValues_rec(pAVar5);
      }
      local_78 = (Abc_Ntk_t *)0x1;
      for (iVar18 = 0; iVar18 < pNtk->vBoxes->nSize; iVar18 = iVar18 + 1) {
        pAVar5 = Abc_NtkBox(pNtk,iVar18);
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
          Abc_NodeSetTravIdPrevious(pAVar5);
        }
      }
    }
    Vec_PtrShrink(pNtk->vCis,pNtk->vCis->nSize - pNtk->nObjCounts[8]);
    pVVar9 = pNtk->vCos;
    Vec_PtrShrink(pVVar9,pVVar9->nSize - pNtk->nObjCounts[8]);
    p = pNtk->vCis;
    p_00 = pNtk->vCos;
    pNtk->vCis = (Vec_Ptr_t *)0x0;
    pNtk->vCos = (Vec_Ptr_t *)0x0;
    p_01 = pNtk->vBoxes;
    pNtk->vBoxes = (Vec_Ptr_t *)0x0;
    p_02 = Vec_PtrAlloc((int)pVVar9);
    for (iVar18 = 0; iVar19 = (int)pVVar9, iVar18 < p_01->nSize; iVar18 = iVar18 + 1) {
      pVVar9 = p_01;
      pvVar8 = Vec_PtrEntry(p_01,iVar18);
      if ((*(uint *)((long)pvVar8 + 0x14) & 0xf) != 8) {
        pVVar9 = p_02;
        Vec_PtrPush(p_02,pvVar8);
      }
    }
    pVVar9 = Vec_PtrAlloc(iVar19);
    p_03 = Vec_PtrAlloc(iVar19);
    for (iVar18 = 0; iVar18 < pVVar6->nSize; iVar18 = iVar18 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pVVar6,iVar18);
      uVar4 = *(uint *)&pAVar5->field_0x14 & 0xf;
      if ((fForward == 0) || (uVar4 != 2 && uVar4 != 5)) {
        if ((fForward == 0) && (0xfffffffd < uVar4 - 5)) {
          pAVar12 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
          pAVar10 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanouts).pArray];
          if ((((*(uint *)&pAVar10->field_0x14 & 0xf) != 5) || (uVar4 != 4)) ||
             ((*(uint *)&pAVar12->field_0x14 & 0xf) != 8)) {
            __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                          ,0x1d3,
                          "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)");
          }
          Abc_NodeSetTravIdCurrent(pAVar12);
          pAVar13 = pAVar5;
          if ((*(byte *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x14) & 0x10
              ) != 0) {
            __assert_fail("!Abc_ObjFanin0(pLatchIn)->fMarkA",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                          ,0x1d6,
                          "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)");
          }
        }
        else {
          pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
          pAVar12 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
          pAVar13 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
          pcVar14 = Abc_ObjName(pAVar12);
          Abc_ObjAssignName(pAVar10,pcVar14,"_out");
          pcVar14 = Abc_ObjName(pAVar12);
          Abc_ObjAssignName(pAVar13,pcVar14,"_in");
          Abc_ObjAddFanin(pAVar10,pAVar12);
          Abc_ObjAddFanin(pAVar12,pAVar13);
          if (fForward == 0) {
            Abc_NodeCollectFanouts(pAVar5,pVVar9);
            for (iVar19 = 0; iVar19 < pVVar9->nSize; iVar19 = iVar19 + 1) {
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar19);
              if ((pAVar11->field_0x14 & 0x10) != 0) {
                Abc_ObjPatchFanin(pAVar11,pAVar5,pAVar10);
              }
            }
          }
          else {
            (pAVar12->field_5).pData = (void *)(2 - (ulong)((pAVar5->field_6).pTemp == (void *)0x0))
            ;
            Abc_NodeCollectFanouts(pAVar5,pVVar9);
            for (iVar19 = 0; iVar19 < pVVar9->nSize; iVar19 = iVar19 + 1) {
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar19);
              if ((pAVar11->field_0x14 & 0x10) == 0) {
                Abc_ObjPatchFanin(pAVar11,pAVar5,pAVar10);
              }
            }
          }
          Abc_ObjAddFanin(pAVar13,pAVar5);
        }
      }
      else {
        if (((uVar4 != 5) ||
            (pAVar12 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray],
            (*(uint *)&pAVar12->field_0x14 & 0xf) != 8)) ||
           (pAVar13 = (Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray],
           (*(uint *)&pAVar13->field_0x14 & 0xf) != 4)) {
          __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                        ,0x1b5,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)");
        }
        Abc_NodeSetTravIdCurrent(pAVar12);
        uVar4 = (pAVar5->vFanouts).nSize;
        uVar16 = 0;
        if (0 < (int)uVar4) {
          uVar16 = (ulong)uVar4;
        }
        uVar17 = 0;
        do {
          if (uVar16 == uVar17) goto LAB_003ba304;
          piVar2 = (pAVar5->vFanouts).pArray + uVar17;
          uVar17 = uVar17 + 1;
        } while ((*(byte *)((long)pAVar5->pNtk->vObjs->pArray[*piVar2] + 0x14) & 0x10) == 0);
        pAVar10 = Abc_NtkCreateNodeBuf
                            (pNtk,(Abc_Obj_t *)
                                  pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanins).pArray]);
        Abc_ObjPatchFanin(pAVar13,(Abc_Obj_t *)
                                  pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanins).pArray],pAVar10);
        Vec_PtrPush(p_03,pAVar10);
        Abc_NodeCollectFanouts(pAVar5,pVVar9);
        for (iVar19 = 0; iVar19 < pVVar9->nSize; iVar19 = iVar19 + 1) {
          pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar9,iVar19);
          if ((pAVar11->field_0x14 & 0x10) != 0) {
            Abc_ObjPatchFanin(pAVar11,pAVar5,pAVar10);
          }
        }
        uVar4 = (pAVar5->vFanouts).nSize;
LAB_003ba304:
        pAVar10 = pAVar5;
        if ((int)uVar4 < 1) {
          __assert_fail("Abc_ObjFanoutNum(pObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                        ,0x1ca,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int)");
        }
      }
      Vec_PtrPush(p,pAVar10);
      Vec_PtrPush(p_02,pAVar12);
      Vec_PtrPush(p_00,pAVar13);
    }
    Vec_PtrFree(pVVar9);
    iVar18 = p_03->nSize;
    iVar19 = 0;
    if (iVar18 < 1) {
      iVar18 = 0;
      iVar19 = 0;
    }
    for (; iVar18 != iVar19; iVar19 = iVar19 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_03,iVar19);
      Abc_ObjTransferFanout
                (pAVar5,(Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
      Abc_NtkDeleteObj(pAVar5);
    }
    Vec_PtrFree(p_03);
    for (iVar18 = 0; iVar18 < p_01->nSize; iVar18 = iVar18 + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar18);
      if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
        iVar19 = Abc_NodeIsTravIdCurrent(pAVar5);
        if (iVar19 == 0) {
          ppvVar3 = pAVar5->pNtk->vObjs->pArray;
          pAVar12 = (Abc_Obj_t *)ppvVar3[*(pAVar5->vFanouts).pArray];
          pAVar13 = (Abc_Obj_t *)ppvVar3[*(pAVar5->vFanins).pArray];
          if (0 < (pAVar12->vFanouts).nSize) {
            Abc_ObjTransferFanout
                      (pAVar12,(Abc_Obj_t *)pAVar13->pNtk->vObjs->pArray[*(pAVar13->vFanins).pArray]
                      );
          }
          Abc_NtkDeleteObj(pAVar12);
          Abc_NtkDeleteObj(pAVar5);
          Abc_NtkDeleteObj(pAVar13);
        }
      }
    }
    pNtk->vCis = p;
    pNtk->vCos = p_00;
    pNtk->vBoxes = p_02;
    Vec_PtrFree(p_01);
  }
  else {
    local_78 = (Abc_Ntk_t *)0x0;
  }
  Vec_PtrFree(pVVar6);
  Abc_NtkCleanMarkA(pNtk);
  return local_78;
}

Assistant:

Abc_Ntk_t * Abc_NtkRetimeMinAreaOne( Abc_Ntk_t * pNtk, int fForward, int fVerbose )
{ 
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vMinCut;
    // mark current latches and TFI(POs)
    Abc_NtkRetimeMinAreaPrepare( pNtk, fForward );
    // run the maximum forward flow
    vMinCut = Abc_NtkMaxFlow( pNtk, fForward, fVerbose );
//    assert( Vec_PtrSize(vMinCut) <= Abc_NtkLatchNum(pNtk) );
    // create new latch boundary if there is improvement
    if ( Vec_PtrSize(vMinCut) < Abc_NtkLatchNum(pNtk) )
    {
        pNtkNew = (Abc_Ntk_t *)1;
        if ( fForward )
            Abc_NtkRetimeMinAreaInitValues( pNtk, vMinCut );
        else
            pNtkNew = Abc_NtkRetimeMinAreaConstructNtk( pNtk, vMinCut );
        Abc_NtkRetimeMinAreaUpdateLatches( pNtk, vMinCut, fForward );
    }
    // clean up
    Vec_PtrFree( vMinCut );
    Abc_NtkCleanMarkA( pNtk );
    return pNtkNew;
}